

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> * __thiscall
QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
::operator[](QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
             *this,QAbstractItemView **key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
  ::tryEmplace_impl<QAbstractItemView*const&>
            (&local_28,
             (QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
              *)this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }